

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

void archive_entry_set_ctime(archive_entry *entry,time_t t,long ns)

{
  long ns_local;
  time_t t_local;
  archive_entry *entry_local;
  
  t_local = ns / 1000000000 + t;
  ns_local = ns % 1000000000;
  if (ns_local < 0) {
    t_local = t_local + -1;
    ns_local = ns_local + 1000000000;
  }
  entry->stat_valid = L'\0';
  entry->ae_set = entry->ae_set | 8;
  (entry->ae_stat).aest_ctime = t_local;
  (entry->ae_stat).aest_ctime_nsec = (uint32_t)ns_local;
  return;
}

Assistant:

void
archive_entry_set_ctime(struct archive_entry *entry, time_t t, long ns)
{
	FIX_NS(t, ns);
	entry->stat_valid = 0;
	entry->ae_set |= AE_SET_CTIME;
	entry->ae_stat.aest_ctime = t;
	entry->ae_stat.aest_ctime_nsec = ns;
}